

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap-reduce.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Options *pOVar3;
  Options *pOVar4;
  Options *var;
  ostream *poVar5;
  undefined8 *in_RSI;
  Options ops;
  bool verbose;
  bool help;
  Session session;
  communicator world;
  environment env;
  undefined4 in_stack_fffffffffffffa58;
  int in_stack_fffffffffffffa5c;
  Session *in_stack_fffffffffffffa60;
  string *in_stack_fffffffffffffa80;
  string *psVar6;
  bool *in_stack_fffffffffffffa88;
  allocator<char> *in_stack_fffffffffffffa90;
  string *psVar7;
  char *in_stack_fffffffffffffa98;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  ostream *out;
  string *in_stack_fffffffffffffac0;
  unsigned_long *in_stack_fffffffffffffac8;
  string *in_stack_fffffffffffffad0;
  undefined8 in_stack_fffffffffffffad8;
  char cVar8;
  allocator<char> local_4c9;
  string local_4c8 [39];
  undefined1 local_4a1 [48];
  undefined1 local_471 [40];
  allocator<char> local_449;
  string local_448 [47];
  undefined1 local_419 [40];
  ostream local_3f1;
  string local_3f0 [47];
  undefined1 local_3c1 [33];
  Session *in_stack_fffffffffffffc60;
  string local_398 [47];
  allocator<char> local_369;
  string local_368 [39];
  allocator<char> local_341;
  string local_340 [47];
  allocator<char> local_311;
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [47];
  allocator<char> local_2b9;
  string local_2b8 [39];
  allocator<char> local_291;
  string local_290 [47];
  allocator<char> local_261;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [103];
  byte local_1d1;
  char **in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  Options *in_stack_ffffffffffffff30;
  communicator local_30;
  undefined8 *local_10;
  int local_4;
  
  cVar8 = (char)((ulong)in_stack_fffffffffffffad8 >> 0x38);
  local_4 = 0;
  local_10 = in_RSI;
  diy::mpi::environment::environment
            ((environment *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,(char **)0x14e14d);
  diy::mpi::communicator::communicator((communicator *)in_stack_fffffffffffffa60);
  Catch::Session::Session(in_stack_fffffffffffffc60);
  opts::Options::Options((Options *)in_stack_fffffffffffffa60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  opts::Option<unsigned_long>
            (cVar8,in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  opts::Options::operator>>
            ((Options *)in_stack_fffffffffffffa60,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  opts::Option<int>(cVar8,in_stack_fffffffffffffad0,(int *)in_stack_fffffffffffffac8,
                    in_stack_fffffffffffffac0);
  opts::Options::operator>>
            ((Options *)in_stack_fffffffffffffa60,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  opts::Option<int>(cVar8,in_stack_fffffffffffffad0,(int *)in_stack_fffffffffffffac8,
                    in_stack_fffffffffffffac0);
  opts::Options::operator>>
            ((Options *)in_stack_fffffffffffffa60,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  cVar8 = (char)((ulong)&local_369 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  opts::Option<int>(cVar8,in_stack_fffffffffffffad0,(int *)in_stack_fffffffffffffac8,
                    in_stack_fffffffffffffac0);
  pOVar3 = opts::Options::operator>>
                     ((Options *)in_stack_fffffffffffffa60,
                      (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                      CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  psVar7 = (string *)&stack0xfffffffffffffc67;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  psVar6 = (string *)local_3c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  opts::Option<int>(cVar8,(string *)pOVar3,(int *)psVar7,psVar6);
  pOVar4 = opts::Options::operator>>
                     ((Options *)in_stack_fffffffffffffa60,
                      (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                      CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  out = &local_3f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  pOVar3 = (Options *)local_419;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  opts::Option<std::__cxx11::string>(psVar7,psVar6,(string *)pOVar4);
  pOVar4 = opts::Options::operator>>
                     ((Options *)in_stack_fffffffffffffa60,
                      (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                      CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  __s = &local_449;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar4,(char *)__s
             ,in_stack_fffffffffffffa90);
  psVar7 = (string *)local_471;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar4,(char *)__s
             ,(allocator<char> *)psVar7);
  opts::Option<bool>((char)((ulong)__s >> 0x38),psVar7,in_stack_fffffffffffffa88,
                     in_stack_fffffffffffffa80);
  var = opts::Options::operator>>
                  ((Options *)in_stack_fffffffffffffa60,
                   (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  psVar6 = (string *)local_4a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar4,(char *)__s
             ,(allocator<char> *)psVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar4,(char *)__s
             ,(allocator<char> *)psVar7);
  opts::Option<bool>((char)((ulong)__s >> 0x38),psVar7,(bool *)var,psVar6);
  opts::Options::operator>>
            ((Options *)in_stack_fffffffffffffa60,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              in_stack_fffffffffffffa60);
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::__cxx11::string::~string((string *)(local_4a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_4a1);
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              in_stack_fffffffffffffa60);
  std::__cxx11::string::~string((string *)(local_471 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_471);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator(&local_449);
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              in_stack_fffffffffffffa60);
  std::__cxx11::string::~string((string *)(local_419 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_419);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              in_stack_fffffffffffffa60);
  std::__cxx11::string::~string((string *)(local_3c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3c1);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc67);
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              in_stack_fffffffffffffa60);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator(&local_369);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator(&local_341);
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              in_stack_fffffffffffffa60);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator(&local_311);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              in_stack_fffffffffffffa60);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator(&local_291);
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              in_stack_fffffffffffffa60);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  bVar1 = opts::Options::parse
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
  if ((bVar1) && ((local_1d1 & 1) == 0)) {
    local_4 = Catch::Session::run(in_stack_fffffffffffffa60);
  }
  else {
    iVar2 = diy::mpi::communicator::rank(&local_30);
    if (iVar2 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Usage: ");
      in_stack_fffffffffffffa60 = (Session *)std::operator<<(poVar5,(char *)*local_10);
      std::operator<<((ostream *)in_stack_fffffffffffffa60," [OPTIONS]\n");
      std::operator<<((ostream *)&std::cout,
                      "Generates random particles in the domain and redistributes them into correct blocks.\n"
                     );
      opts::operator<<(out,pOVar3);
    }
    local_4 = 1;
  }
  opts::Options::~Options((Options *)in_stack_fffffffffffffa60);
  Catch::Session::~Session(in_stack_fffffffffffffa60);
  diy::mpi::communicator::~communicator((communicator *)0x14ef6d);
  diy::mpi::environment::~environment((environment *)0x14ef7a);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment     env(argc, argv); // equivalent of MPI_Init(argc, argv)/MPI_Finalize()
    diy::mpi::communicator    world;           // equivalent of MPI_COMM_WORLD

    Catch::Session session;

    bool help, verbose;

    // get command line arguments
    using namespace opts;
    Options ops;
    ops
        >> Option('n', "number",  SwapReduceFixture::num_points,     "number of points per block")
        >> Option('k', "k",       SwapReduceFixture::k,              "use k-ary swap")
        >> Option('b', "blocks",  SwapReduceFixture::nblocks,        "number of blocks")
        >> Option('t', "thread",  SwapReduceFixture::threads,        "number of threads")
        >> Option('m', "memory",  SwapReduceFixture::mem_blocks,     "number of blocks to keep in memory")
        >> Option(     "prefix",  SwapReduceFixture::prefix,         "prefix for external storage")
        >> Option('v', "verbose", verbose,                           "print the block contents")
        >> Option('h', "help",    help,                              "show help")
        ;
    if (!ops.parse(argc,argv) || help)
    {
        if (world.rank() == 0)
        {
            std::cout << "Usage: " << argv[0] << " [OPTIONS]\n";
            std::cout << "Generates random particles in the domain and redistributes them into correct blocks.\n";
            std::cout << ops;
        }
        return 1;
    }

    return session.run();
}